

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O0

bool higan::System::MakeDirIfNotExist(string *dir_path,bool loop_create)

{
  bool bVar1;
  ulong uVar2;
  char *__path;
  int *piVar3;
  undefined1 local_40 [8];
  string parent_path;
  int result;
  bool loop_create_local;
  string *dir_path_local;
  
  parent_path.field_2._M_local_buf[0xf] = loop_create;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    dir_path_local._7_1_ = 0;
    goto LAB_00127b30;
  }
  __path = (char *)std::__cxx11::string::c_str();
  parent_path.field_2._8_4_ = mkdir(__path,0x1e4);
  if (parent_path.field_2._8_4_ == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 0x11) {
      dir_path_local._7_1_ = 1;
      goto LAB_00127b30;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 2) {
      dir_path_local._7_1_ = 0;
      goto LAB_00127b30;
    }
    if ((parent_path.field_2._M_local_buf[0xf] & 1U) == 0) {
      dir_path_local._7_1_ = 0;
      goto LAB_00127b30;
    }
    std::__cxx11::string::find_last_of((char)dir_path,0x2f);
    std::__cxx11::string::substr((ulong)local_40,(ulong)dir_path);
    bVar1 = MakeDirIfNotExist((string *)local_40,false);
    if (bVar1) {
      dir_path_local._7_1_ = MakeDirIfNotExist(dir_path,false);
    }
    std::__cxx11::string::~string((string *)local_40);
    if (bVar1) goto LAB_00127b30;
  }
  dir_path_local._7_1_ = 1;
LAB_00127b30:
  return (bool)(dir_path_local._7_1_ & 1);
}

Assistant:

bool System::MakeDirIfNotExist(const std::string& dir_path, bool loop_create)
{
	if (dir_path.empty())
	{
		return false;
	}

	int result = mkdir(dir_path.c_str(), S_IRWXU | S_IRGRP | S_IROTH);
	if (result == -1)
	{
		if (errno == EEXIST)
		{
			return true;
		}
		else if (errno == ENOENT)
		{
			if (!loop_create)
			{
				return false;
			}

			std::string parent_path = dir_path.substr(0, dir_path.find_last_of('/'));

			if (MakeDirIfNotExist(parent_path, false))
			{
				return MakeDirIfNotExist(dir_path, false);
			}
		}
		else
		{
			return false;
		}
	}

	return true;
}